

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void constInsert(WhereConst *pConst,Expr *pColumn,Expr *pValue)

{
  long lVar1;
  void *pvVar2;
  void *in_RDX;
  sqlite3 *in_RSI;
  long in_RDI;
  Expr *pExpr;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 8) <= iVar3) {
      *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
      pvVar2 = sqlite3DbReallocOrFree(in_RSI,in_RDX,CONCAT44(iVar3,in_stack_ffffffffffffffe0));
      *(void **)(in_RDI + 0x10) = pvVar2;
      if (*(long *)(in_RDI + 0x10) == 0) {
        *(undefined4 *)(in_RDI + 8) = 0;
      }
      else {
        if ((*(uint *)((long)in_RDX + 4) & 8) != 0) {
          in_RDX = *(void **)((long)in_RDX + 0x10);
        }
        *(sqlite3 **)(*(long *)(in_RDI + 0x10) + (long)(*(int *)(in_RDI + 8) * 2 + -2) * 8) = in_RSI
        ;
        *(void **)(*(long *)(in_RDI + 0x10) + (long)(*(int *)(in_RDI + 8) * 2 + -1) * 8) = in_RDX;
      }
      return;
    }
    lVar1 = *(long *)(*(long *)(in_RDI + 0x10) + (long)(iVar3 << 1) * 8);
    if ((*(u32 *)(lVar1 + 0x2c) == in_RSI->mDbFlags) &&
       (*(short *)(lVar1 + 0x30) == (short)in_RSI->flags)) break;
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

static void constInsert(
  WhereConst *pConst,      /* The WhereConst into which we are inserting */
  Expr *pColumn,           /* The COLUMN part of the constraint */
  Expr *pValue             /* The VALUE part of the constraint */
){
  int i;
  assert( pColumn->op==TK_COLUMN );

  /* 2018-10-25 ticket [cf5ed20f]
  ** Make sure the same pColumn is not inserted more than once */
  for(i=0; i<pConst->nConst; i++){
    const Expr *pExpr = pConst->apExpr[i*2];
    assert( pExpr->op==TK_COLUMN );
    if( pExpr->iTable==pColumn->iTable
     && pExpr->iColumn==pColumn->iColumn
    ){
      return;  /* Already present.  Return without doing anything. */
    }
  }

  pConst->nConst++;
  pConst->apExpr = sqlite3DbReallocOrFree(pConst->pParse->db, pConst->apExpr,
                         pConst->nConst*2*sizeof(Expr*));
  if( pConst->apExpr==0 ){
    pConst->nConst = 0;
  }else{
    if( ExprHasProperty(pValue, EP_FixedCol) ) pValue = pValue->pLeft;
    pConst->apExpr[pConst->nConst*2-2] = pColumn;
    pConst->apExpr[pConst->nConst*2-1] = pValue;
  }
}